

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateBuilder
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  undefined1 local_d0 [8];
  MessageBuilderGenerator builderGenerator;
  string local_58;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "@java.lang.Override\npublic Builder newBuilderForType() { return newBuilder(); }\n");
  io::Printer::Print<>(printer,local_28);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,
             "public static Builder newBuilder() {\n  return DEFAULT_INSTANCE.toBuilder();\n}\npublic static Builder newBuilder($classname$ prototype) {\n  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n}\n@java.lang.Override\npublic Builder toBuilder() {\n  return this == DEFAULT_INSTANCE\n      ? new Builder() : new Builder().mergeFrom(this);\n}\n\n"
            );
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_58,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar1,local_38,(char (*) [10])0xa117a7,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &builderGenerator.oneofs_.
              super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
              .
              super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
              .
              super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
              .tree_.size_,
             "@java.lang.Override\nprotected Builder newBuilderForType(\n    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n  Builder builder = new Builder(parent);\n  return builder;\n}\n"
            );
  io::Printer::Print<>(pPVar1,stack0xffffffffffffff88);
  MessageBuilderGenerator::MessageBuilderGenerator
            ((MessageBuilderGenerator *)local_d0,(this->super_MessageGenerator).descriptor_,
             this->context_);
  MessageBuilderGenerator::Generate((MessageBuilderGenerator *)local_d0,local_18);
  MessageBuilderGenerator::~MessageBuilderGenerator((MessageBuilderGenerator *)local_d0);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateBuilder(io::Printer* printer) {
  // LITE_RUNTIME implements this at the GeneratedMessageLite level.
  printer->Print(
      "@java.lang.Override\n"
      "public Builder newBuilderForType() { return newBuilder(); }\n");

  printer->Print(
      "public static Builder newBuilder() {\n"
      "  return DEFAULT_INSTANCE.toBuilder();\n"
      "}\n"
      "public static Builder newBuilder($classname$ prototype) {\n"
      "  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n"
      "}\n"
      "@java.lang.Override\n"
      "public Builder toBuilder() {\n"
      "  return this == DEFAULT_INSTANCE\n"
      "      ? new Builder() : new Builder().mergeFrom(this);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "@java.lang.Override\n"
      "protected Builder newBuilderForType(\n"
      "    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n"
      "  Builder builder = new Builder(parent);\n"
      "  return builder;\n"
      "}\n");

  MessageBuilderGenerator builderGenerator(descriptor_, context_);
  builderGenerator.Generate(printer);
}